

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O1

void __thiscall DStoredCommand::Tick(DStoredCommand *this)

{
  FConsoleCommand *pFVar1;
  FCommandLine args;
  char *local_30;
  undefined4 local_28;
  void *local_20;
  undefined1 local_10;
  
  if ((this->Text != (char *)0x0) && (pFVar1 = this->Command, pFVar1 != (FConsoleCommand *)0x0)) {
    local_28 = 0xffffffff;
    local_20 = (void *)0x0;
    local_10 = 0;
    local_30 = this->Text;
    (*pFVar1->_vptr_FConsoleCommand[3])(pFVar1,&local_30,(&players)[(long)consoleplayer * 0x54],0);
    if (local_20 != (void *)0x0) {
      operator_delete__(local_20);
    }
  }
  (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
  return;
}

Assistant:

void DStoredCommand::Tick ()
{
	if (Text != NULL && Command != NULL)
	{
		FCommandLine args (Text);
		Command->Run (args, players[consoleplayer].mo, 0);
	}
	Destroy ();
}